

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uciengine.cpp
# Opt level: O2

void __thiscall banksia::UciEngine::newGame(UciEngine *this)

{
  int iVar1;
  ssize_t sVar2;
  size_t __n;
  void *__buf;
  allocator local_39;
  string local_38 [32];
  
  __n = (size_t)MoveFull::illegalMove.super_Move.promotion;
  (this->ponderingMove).promotion = MoveFull::illegalMove.super_Move.promotion;
  iVar1 = MoveFull::illegalMove.super_Move.dest;
  (this->ponderingMove).from = MoveFull::illegalMove.super_Move.from;
  (this->ponderingMove).dest = iVar1;
  this->expectingBestmove = false;
  (this->super_EngineProfile).super_Engine.computingState = idle;
  std::__cxx11::string::string(local_38,"ucinewgame",&local_39);
  sVar2 = Engine::write((Engine *)this,(int)local_38,__buf,__n);
  std::__cxx11::string::~string(local_38);
  if ((char)sVar2 != '\0') {
    Player::setState((Player *)this,playing);
  }
  return;
}

Assistant:

void UciEngine::newGame()
{
    assert(getState() == PlayerState::ready);
    ponderingMove = MoveFull::illegalMove;
    expectingBestmove = false;
    computingState = EngineComputingState::idle;
    if (write("ucinewgame")) {
        setState(PlayerState::playing);
    }
}